

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

void setfenv(lua_State *L)

{
  int iVar1;
  lua_State *in_RDI;
  lua_Debug ar;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  lua_State *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  lua_State *in_stack_ffffffffffffff98;
  
  iVar1 = lua_getstack(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                       (lua_Debug *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (iVar1 != 0) {
    iVar1 = lua_getinfo(in_stack_ffffffffffffff80,
                        (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (lua_Debug *)0x13c2a4);
    if (iVar1 != 0) {
      iVar1 = lua_iscfunction((lua_State *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff8c);
      if (iVar1 == 0) goto LAB_0013c2d6;
    }
  }
  luaL_error(in_RDI,"\'module\' not called from a Lua function");
LAB_0013c2d6:
  lua_pushvalue((lua_State *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff8c);
  lua_setfenv((lua_State *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
              in_stack_ffffffffffffff8c);
  lua_settop(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  return;
}

Assistant:

static void setfenv(lua_State *L)
{
  lua_Debug ar;
  if (lua_getstack(L, 1, &ar) == 0 ||
      lua_getinfo(L, "f", &ar) == 0 ||  /* get calling function */
      lua_iscfunction(L, -1))
    luaL_error(L, LUA_QL("module") " not called from a Lua function");
  lua_pushvalue(L, -2);
  lua_setfenv(L, -2);
  lua_pop(L, 1);
}